

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::XMLScanner::loadGrammar
          (XMLScanner *this,XMLCh *systemId,short grammarType,bool toCache)

{
  bool bVar1;
  int iVar2;
  Codes CVar3;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  undefined4 extraout_var_00;
  Janitor<xercesc_4_0::InputSource> local_190;
  Janitor<xercesc_4_0::InputSource> janSrc;
  XMLException *excToCatch;
  MalformedURLException e_2;
  MalformedURLException e_1;
  undefined1 local_118 [8];
  MalformedURLException e;
  XMLURL tmpURL;
  undefined1 local_80 [8];
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo;
  InputSource *srcToUse;
  bool toCache_local;
  short grammarType_local;
  XMLCh *systemId_local;
  XMLScanner *this_local;
  
  lastInfo.colNumber = 0;
  if (this->fEntityHandler != (XMLEntityHandler *)0x0) {
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo
              ((LastExtEntityInfo *)&resourceIdentifier.fLocator);
    ReaderMgr::getLastExtEntityInfo
              (&this->fReaderMgr,(LastExtEntityInfo *)&resourceIdentifier.fLocator);
    XMLResourceIdentifier::XMLResourceIdentifier
              ((XMLResourceIdentifier *)local_80,ExternalEntity,systemId,(XMLCh *)0x0,L"",
               (XMLCh *)resourceIdentifier.fLocator,&(this->fReaderMgr).super_Locator);
    iVar2 = (*this->fEntityHandler->_vptr_XMLEntityHandler[5])
                      (this->fEntityHandler,(XMLResourceIdentifier *)local_80);
    lastInfo.colNumber = CONCAT44(extraout_var,iVar2);
    XMLResourceIdentifier::~XMLResourceIdentifier((XMLResourceIdentifier *)local_80);
  }
  if (lastInfo.colNumber != 0) goto LAB_00386aaf;
  if ((this->fDisableDefaultEntityResolution & 1U) != 0) {
    return (Grammar *)0x0;
  }
  XMLURL::XMLURL((XMLURL *)&e.super_XMLException.fMemoryManager,this->fMemoryManager);
  bVar1 = XMLURL::parse(systemId,(XMLURL *)&e.super_XMLException.fMemoryManager);
  if (bVar1) {
    bVar1 = XMLURL::isRelative((XMLURL *)&e.super_XMLException.fMemoryManager);
    if (bVar1) {
      if ((this->fStandardUriConformant & 1U) == 0) {
        lastInfo.colNumber = (XMLFileLoc)XMemory::operator_new(0x30,this->fMemoryManager);
        LocalFileInputSource::LocalFileInputSource
                  ((LocalFileInputSource *)lastInfo.colNumber,systemId,this->fMemoryManager);
        goto LAB_003868b3;
      }
      MalformedURLException::MalformedURLException
                ((MalformedURLException *)local_118,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                 ,0x6b0,URL_NoProtocolPresent,this->fMemoryManager);
      this->fInException = true;
      CVar3 = XMLException::getCode((XMLException *)local_118);
      pXVar4 = XMLException::getMessage((XMLException *)local_118);
      emitError(this,XMLException_Fatal,CVar3,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (XMLScanner *)0x0;
      bVar1 = true;
      MalformedURLException::~MalformedURLException((MalformedURLException *)local_118);
    }
    else if (((this->fStandardUriConformant & 1U) == 0) ||
            (bVar1 = XMLURL::hasInvalidChar((XMLURL *)&e.super_XMLException.fMemoryManager), !bVar1)
            ) {
      lastInfo.colNumber = (XMLFileLoc)XMemory::operator_new(0x88,this->fMemoryManager);
      URLInputSource::URLInputSource
                ((URLInputSource *)lastInfo.colNumber,(XMLURL *)&e.super_XMLException.fMemoryManager
                 ,this->fMemoryManager);
LAB_003868b3:
      bVar1 = false;
    }
    else {
      MalformedURLException::MalformedURLException
                ((MalformedURLException *)&e_2.super_XMLException.fMemoryManager,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                 ,0x6be,URL_MalformedURL,this->fMemoryManager);
      this->fInException = true;
      CVar3 = XMLException::getCode((XMLException *)&e_2.super_XMLException.fMemoryManager);
      pXVar4 = XMLException::getMessage((XMLException *)&e_2.super_XMLException.fMemoryManager);
      emitError(this,XMLException_Fatal,CVar3,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (XMLScanner *)0x0;
      bVar1 = true;
      MalformedURLException::~MalformedURLException
                ((MalformedURLException *)&e_2.super_XMLException.fMemoryManager);
    }
  }
  else {
    if ((this->fStandardUriConformant & 1U) == 0) {
      lastInfo.colNumber = (XMLFileLoc)XMemory::operator_new(0x30,this->fMemoryManager);
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)lastInfo.colNumber,systemId,this->fMemoryManager);
      goto LAB_003868b3;
    }
    MalformedURLException::MalformedURLException
              ((MalformedURLException *)&excToCatch,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
               ,0x6d3,URL_MalformedURL,(MemoryManager *)0x0);
    this->fInException = true;
    CVar3 = XMLException::getCode((XMLException *)&excToCatch);
    pXVar4 = XMLException::getMessage((XMLException *)&excToCatch);
    emitError(this,XMLException_Fatal,CVar3,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    this_local = (XMLScanner *)0x0;
    bVar1 = true;
    MalformedURLException::~MalformedURLException((MalformedURLException *)&excToCatch);
  }
  XMLURL::~XMLURL((XMLURL *)&e.super_XMLException.fMemoryManager);
  if (bVar1) {
    return (Grammar *)this_local;
  }
LAB_00386aaf:
  Janitor<xercesc_4_0::InputSource>::Janitor(&local_190,(InputSource *)lastInfo.colNumber);
  iVar2 = (*(this->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[9])
                    (this,lastInfo.colNumber,(ulong)(uint)(int)grammarType,(ulong)(toCache & 1));
  Janitor<xercesc_4_0::InputSource>::~Janitor(&local_190);
  return (Grammar *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

Grammar* XMLScanner::loadGrammar(const   XMLCh* const systemId
                                 , const short        grammarType
                                 , const bool         toCache)
{
    InputSource* srcToUse = 0;

    if (fEntityHandler){
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            systemId, 0, XMLUni::fgZeroLenString, lastInfo.systemId,
                            &fReaderMgr);
        srcToUse = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //  First we try to parse it as a URL. If that fails, we assume its
    //  a file and try it that way.
    if (!srcToUse) {
        if (fDisableDefaultEntityResolution)
            return 0;

        try
        {
            //  Create a temporary URL. Since this is the primary document,
            //  it has to be fully qualified. If not, then assume we are just
            //  mistaking a file for a URL.
            XMLURL tmpURL(fMemoryManager);

            if (XMLURL::parse(systemId, tmpURL)) {

                if (tmpURL.isRelative())
                {
                    if (!fStandardUriConformant)
                        srcToUse = new (fMemoryManager) LocalFileInputSource(systemId, fMemoryManager);
                    else {
                        // since this is the top of the try/catch, cannot call ThrowXMLwithMemMgr
                        // emit the error directly
                        MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
                        fInException = true;
                        emitError
                        (
                            XMLErrs::XMLException_Fatal
                            , e.getCode()
                            , e.getMessage()
                        );
                        return 0;
                    }
                }
                else
                {
                    if (fStandardUriConformant && tmpURL.hasInvalidChar()) {
                        MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_MalformedURL, fMemoryManager);
                        fInException = true;
                        emitError
                        (
                            XMLErrs::XMLException_Fatal
                            , e.getCode()
                            , e.getMessage()
                        );
                        return 0;
                    }
                    srcToUse = new (fMemoryManager) URLInputSource(tmpURL, fMemoryManager);
                }
            }
            else
            {
                if (!fStandardUriConformant)
                    srcToUse = new (fMemoryManager) LocalFileInputSource(systemId, fMemoryManager);
                else {
                    // since this is the top of the try/catch, cannot call ThrowXMLwithMemMgr
                    // emit the error directly
                    // lazy bypass ... since all MalformedURLException are fatal, no need to check the type
                    MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_MalformedURL);
                    fInException = true;
                    emitError
                    (
                        XMLErrs::XMLException_Fatal
                        , e.getCode()
                        , e.getMessage()
                    );
                    return 0;
                }
            }
        }
        catch(const XMLException& excToCatch)
        {
            //  For any other XMLException,
            //  emit the error and catch any user exception thrown from here.
            fInException = true;
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
                return 0;
        }
    }

    Janitor<InputSource> janSrc(srcToUse);
    return loadGrammar(*srcToUse, grammarType, toCache);
}